

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp3-read.c
# Opt level: O3

int mp3_skip_id3v2(file_t *mp3,mp3_frame_t *frame)

{
  ulong uVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  uchar id3v2_hdr [10];
  uchar local_10;
  byte local_f;
  byte local_e;
  byte local_d;
  byte local_c;
  byte local_b;
  
  if (mp3 == (file_t *)0x0) {
    __assert_fail("mp3 != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/mp3-read.c",0x2e3,
                  "int mp3_skip_id3v2(file_t *, mp3_frame_t *)");
  }
  if (frame != (mp3_frame_t *)0x0) {
    uVar2 = 0;
    if ((*(uint *)frame->raw & 0xffffff) == 0x334449) {
      iVar3 = file_read(mp3,&local_10,6);
      uVar2 = 0xffffffff;
      if (iVar3 == 6) {
        uVar4 = (ulong)((local_c & 0x7f) << 7 | (local_d & 0x7f) << 0xe | (local_e & 0x7f) << 0x15);
        uVar1 = uVar4 + 10;
        if ((local_f & 0x10) == 0) {
          uVar1 = uVar4;
        }
        iVar3 = file_seek_fwd(mp3,uVar1 + (local_b & 0x7f));
        uVar2 = (uint)(iVar3 != 0);
      }
    }
    return uVar2;
  }
  __assert_fail("frame != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/mp3-read.c",0x2e4,
                "int mp3_skip_id3v2(file_t *, mp3_frame_t *)");
}

Assistant:

int mp3_skip_id3v2(file_t *mp3, mp3_frame_t *frame) {
  assert(mp3 != NULL);
  assert(frame != NULL);

  unsigned char id3v2_hdr[10];
  memcpy(id3v2_hdr, frame->raw, 4);
  if ((id3v2_hdr[0] != 'I') ||
      (id3v2_hdr[1] != 'D') ||
      (id3v2_hdr[2] != '3'))
    return 0;

  if (file_read(mp3, id3v2_hdr + 4, 6) != 6)
    return EEOF;

  /* parse synchsafe integer */
  size_t tag_size = (((id3v2_hdr[6] & 0x7F) << 21) |
                     ((id3v2_hdr[7] & 0x7F) << 14) |
                     ((id3v2_hdr[8] & 0x7F) << 7) |
                     (id3v2_hdr[9] & 0x7F)) +
                    (id3v2_hdr[5] & 0x10 ? 10 : 0);

  if (!file_seek_fwd(mp3, tag_size))
    return 0;

  return 1;
}